

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioSerialRead(uint gpio,void *buf,size_t bufSize)

{
  int *piVar1;
  ulong uVar2;
  FILE *pFVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  
  pFVar3 = _stderr;
  uVar2 = (ulong)gpio;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar3,"%s %s: gpio=%d buf=%08X bufSize=%d\n",myTimeStamp::buf,"gpioSerialRead",uVar2,
            (ulong)buf & 0xffffffff,bufSize);
  }
  pFVar3 = _stderr;
  if (libInitialised == '\0') {
    iVar5 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    pcVar6 = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
LAB_00117220:
    fprintf(pFVar3,pcVar6,myTimeStamp::buf,"gpioSerialRead");
  }
  else {
    if (gpio < 0x20) {
      if (bufSize == 0) {
        iVar5 = -0x33;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x33;
        }
        myTimeStamp();
        pcVar6 = "%s %s: buffer size can\'t be zero\n";
        goto LAB_00117220;
      }
      if (wfRx[uVar2].mode == 1) {
        if (wfRx[uVar2].field_4.s.readPos == wfRx[uVar2].field_4.s.writePos) {
          return 0;
        }
        uVar4 = wfRx[uVar2].field_4.s.writePos;
        if (uVar4 <= (uint)wfRx[uVar2].field_4.s.readPos) {
          uVar4 = wfRx[uVar2].field_4.s.bufSize;
        }
        uVar4 = uVar4 - wfRx[uVar2].field_4.s.readPos;
        uVar7 = bufSize & 0xffffffff;
        if (uVar4 <= bufSize) {
          uVar7 = (ulong)uVar4;
        }
        uVar4 = (int)(uVar7 / (uint)wfRx[uVar2].field_4.s.bytes) * wfRx[uVar2].field_4.s.bytes;
        if (buf != (void *)0x0) {
          memcpy(buf,wfRx[uVar2].field_4.s.buf + wfRx[uVar2].field_4.s.readPos,(ulong)uVar4);
        }
        piVar1 = &wfRx[uVar2].field_4.s.readPos;
        *piVar1 = *piVar1 + uVar4;
        if ((uint)wfRx[uVar2].field_4.s.readPos < wfRx[uVar2].field_4.s.bufSize) {
          return uVar4;
        }
        wfRx[uVar2].field_4.s.readPos = 0;
        return uVar4;
      }
      iVar5 = -0x26;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x26;
      }
      myTimeStamp();
      pcVar6 = "%s %s: no serial read on gpio (%d)\n";
    }
    else {
      iVar5 = -2;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -2;
      }
      myTimeStamp();
      pcVar6 = "%s %s: bad gpio (%d)\n";
    }
    fprintf(pFVar3,pcVar6,myTimeStamp::buf,"gpioSerialRead",uVar2);
  }
  return iVar5;
}

Assistant:

int gpioSerialRead(unsigned gpio, void *buf, size_t bufSize)
{
   unsigned bytes=0, wpos;
   volatile wfRx_t *w;

   DBG(DBG_USER, "gpio=%d buf=%08X bufSize=%d", gpio, (int)buf, bufSize);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   if (bufSize == 0)
      SOFT_ERROR(PI_BAD_SERIAL_COUNT, "buffer size can't be zero");

   if (wfRx[gpio].mode != PI_WFRX_SERIAL)
      SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

   w = &wfRx[gpio];

   if (w->s.readPos != w->s.writePos)
   {
      wpos = w->s.writePos;

      if (wpos > w->s.readPos) bytes = wpos - w->s.readPos;
      else                     bytes = w->s.bufSize - w->s.readPos;

      if (bytes > bufSize) bytes = bufSize;

      /* copy in multiples of the data size in bytes */

      bytes = (bytes / w->s.bytes) * w->s.bytes;

      if (buf) memcpy(buf, w->s.buf+w->s.readPos, bytes);

      w->s.readPos += bytes;

      if (w->s.readPos >= w->s.bufSize) w->s.readPos = 0;
   }
   return bytes;
}